

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int parse_tags(y4m_input *y4m_ctx,FILE *file)

{
  int iVar1;
  int *in_RDI;
  char end;
  char tag [256];
  undefined7 in_stack_fffffffffffffee0;
  char in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  y4m_input *in_stack_fffffffffffffef8;
  int local_4;
  
  *in_RDI = -1;
  in_RDI[1] = -1;
  in_RDI[2] = -1;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined1 *)(in_RDI + 6) = 0x3f;
  in_RDI[0x21] = 0;
  snprintf((char *)(in_RDI + 0xb),0x10,"420");
  while( true ) {
    iVar1 = copy_tag((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8,
                     (FILE *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = y4m_parse_tags(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    if (iVar1 != 0) break;
    if (in_stack_fffffffffffffee7 == '\n') {
      if (*in_RDI == -1) {
        fprintf(_stderr,"Width field missing\n");
        local_4 = 0;
      }
      else if (in_RDI[1] == -1) {
        fprintf(_stderr,"Height field missing\n");
        local_4 = 0;
      }
      else if (in_RDI[2] == -1) {
        fprintf(_stderr,"FPS field missing\n");
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
      return local_4;
    }
  }
  return 0;
}

Assistant:

static int parse_tags(y4m_input *y4m_ctx, FILE *file) {
  char tag[256];
  char end;  // Character denoting the end of the tag, ' ' or '\n'.
  // Set Y4M tags to defaults, updating them as processing occurs. Mandatory
  // fields are marked with -1 and will be checked after the tags are parsed.
  y4m_ctx->pic_w = -1;
  y4m_ctx->pic_h = -1;
  y4m_ctx->fps_n = -1;  // Also serves as marker for fps_d
  y4m_ctx->par_n = 0;
  y4m_ctx->par_d = 0;
  y4m_ctx->interlace = '?';
  y4m_ctx->color_range = AOM_CR_STUDIO_RANGE;
  snprintf(y4m_ctx->chroma_type, sizeof(y4m_ctx->chroma_type), "420");

  // Find one tag at a time.
  do {
    if (!copy_tag(tag, sizeof(tag), &end, file)) {
      return 0;
    }
    // y4m_parse_tags returns 0 on success.
    if (y4m_parse_tags(y4m_ctx, tag)) {
      return 0;
    }
  } while (end != '\n');

  // Check the mandatory fields.
  if (y4m_ctx->pic_w == -1) {
    fprintf(stderr, "Width field missing\n");
    return 0;
  }
  if (y4m_ctx->pic_h == -1) {
    fprintf(stderr, "Height field missing\n");
    return 0;
  }
  if (y4m_ctx->fps_n == -1) {
    fprintf(stderr, "FPS field missing\n");
    return 0;
  }
  return 1;
}